

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O2

void __thiscall ThreadPool::~ThreadPool(ThreadPool *this)

{
  stop(this);
  std::__cxx11::_List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>::
  _M_clear(&(this->_task).
            super__List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>);
  std::condition_variable::~condition_variable(&this->_completeCreation);
  std::condition_variable::~condition_variable(&this->_waiting);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->_exit).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->_run).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->_worker);
  return;
}

Assistant:

ThreadPool::~ThreadPool()
{
    stop();
}